

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O2

void __thiscall
Rml::ElementBackgroundBorder::GenerateGeometry(ElementBackgroundBorder *this,Element *element)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  Colour<unsigned_char,_255,_true> background_color;
  int iVar4;
  RenderManager *mesh_00;
  ComputedValues *this_00;
  Element *element_00;
  Property *this_01;
  Background *this_02;
  int i;
  int index;
  CornerSizes border_radius;
  BoxShadowList *in_stack_fffffffffffffec8;
  BoxShadowList shadow_list;
  _Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> local_b8;
  ColourbPremultiplied border_colors [4];
  anon_class_8_2_2b02ffb6 ConvertColor;
  _Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> local_78;
  Mesh mesh;
  
  mesh_00 = Element::GetRenderManager(element);
  if (mesh_00 != (RenderManager *)0x0) {
    this_00 = Element::GetComputedValues(element);
    uVar1 = *(uint *)&this_00->rare;
    ConvertColor.opacity = (this_00->inherited).opacity;
    ConvertColor.apply_opacity = ConvertColor.opacity < 1.0 && (uVar1 >> 0x1c & 1) == 0;
    background_color =
         GenerateGeometry::anon_class_8_2_2b02ffb6::operator()
                   (&ConvertColor,(this_00->common).background_color);
    border_colors[0] =
         GenerateGeometry::anon_class_8_2_2b02ffb6::operator()
                   (&ConvertColor,(this_00->common).border_top_color);
    border_colors[1] =
         GenerateGeometry::anon_class_8_2_2b02ffb6::operator()
                   (&ConvertColor,(this_00->common).border_right_color);
    border_colors[2] =
         GenerateGeometry::anon_class_8_2_2b02ffb6::operator()
                   (&ConvertColor,(this_00->common).border_bottom_color);
    border_colors[3] =
         GenerateGeometry::anon_class_8_2_2b02ffb6::operator()
                   (&ConvertColor,(this_00->common).border_left_color);
    border_radius = Style::ComputedValues::border_radius(this_00);
    index = 0;
    element_00 = (Element *)GetOrCreateBackground(this,BackgroundBorder);
    Geometry::Release(&mesh,(Geometry *)element_00,ClearMesh);
    while( true ) {
      iVar4 = Element::GetNumBoxes(element);
      if (iVar4 <= index) break;
      Element::GetRenderBox((RenderBox *)&shadow_list,element,Padding,index);
      MeshUtilities::GenerateBackgroundBorder
                (&mesh,(RenderBox *)&shadow_list,background_color,border_colors);
      index = index + 1;
    }
    RenderManager::MakeGeometry((RenderManager *)&shadow_list,(Mesh *)mesh_00);
    UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::operator=((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                 *)element_00,
                (UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                 *)&shadow_list);
    UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::~UniqueRenderResource
              ((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                *)&shadow_list);
    if ((uVar1 >> 0x1c & 1) != 0) {
      this_01 = Element::GetLocalProperty(element,BoxShadow);
      if ((this_01->value).type != BOXSHADOWLIST) {
        bVar3 = Assert("RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST)",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementBackgroundBorder.cpp"
                       ,0xa3);
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
      }
      local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Variant::Get<std::vector<Rml::BoxShadow,std::allocator<Rml::BoxShadow>>>
                (&shadow_list,&this_01->value,
                 (vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)&local_78);
      ::std::_Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::~_Vector_base(&local_78)
      ;
      this_02 = GetOrCreateBackground(this,BoxShadow);
      local_b8._M_impl.super__Vector_impl_data._M_start =
           shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_b8._M_impl.super__Vector_impl_data._M_finish =
           shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_b8._M_impl.super__Vector_impl_data._M_end_of_storage =
           shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GeometryBoxShadow::Generate
                ((GeometryBoxShadow *)this_02,(Geometry *)&this_02->texture,
                 (CallbackTexture *)mesh_00,(RenderManager *)element,element_00,
                 (Geometry *)&local_b8,in_stack_fffffffffffffec8,border_radius,
                 (this_00->inherited).opacity);
      ::std::_Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::~_Vector_base(&local_b8)
      ;
      ::std::_Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::~_Vector_base
                (&shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>);
    }
    Mesh::~Mesh(&mesh);
  }
  return;
}

Assistant:

void ElementBackgroundBorder::GenerateGeometry(Element* element)
{
	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return;

	const ComputedValues& computed = element->GetComputedValues();
	const bool has_box_shadow = computed.has_box_shadow();
	const float opacity = computed.opacity();

	// Apply opacity except if we have a box shadow. In the latter case the background is rendered opaquely into the box-shadow texture, while
	// opacity is applied to the entire box-shadow texture when that is rendered.
	bool apply_opacity = (!has_box_shadow && opacity < 1.f);

	auto ConvertColor = [=](Colourb color) {
		if (apply_opacity)
			return color.ToPremultiplied(opacity);
		else
			return color.ToPremultiplied();
	};

	ColourbPremultiplied background_color = ConvertColor(computed.background_color());
	ColourbPremultiplied border_colors[4] = {
		ConvertColor(computed.border_top_color()),
		ConvertColor(computed.border_right_color()),
		ConvertColor(computed.border_bottom_color()),
		ConvertColor(computed.border_left_color()),
	};
	const CornerSizes border_radius = computed.border_radius();

	Geometry& geometry = GetOrCreateBackground(BackgroundType::BackgroundBorder).geometry;
	Mesh mesh = geometry.Release(Geometry::ReleaseMode::ClearMesh);

	for (int i = 0; i < element->GetNumBoxes(); i++)
		MeshUtilities::GenerateBackgroundBorder(mesh, element->GetRenderBox(BoxArea::Padding, i), background_color, border_colors);

	geometry = render_manager->MakeGeometry(std::move(mesh));

	if (has_box_shadow)
	{
		Geometry& background_border_geometry = geometry;

		const Property* p_box_shadow = element->GetLocalProperty(PropertyId::BoxShadow);
		RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST);
		BoxShadowList shadow_list = p_box_shadow->value.Get<BoxShadowList>();

		// Generate the geometry for the box-shadow texture.
		Background& shadow_background = GetOrCreateBackground(BackgroundType::BoxShadow);
		Geometry& shadow_geometry = shadow_background.geometry;
		CallbackTexture& shadow_texture = shadow_background.texture;

		GeometryBoxShadow::Generate(shadow_geometry, shadow_texture, *render_manager, element, background_border_geometry, std::move(shadow_list),
			border_radius, computed.opacity());
	}
}